

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main0(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  uint *puVar2;
  Record *local_128;
  Record *r;
  iterator iStack_118;
  int it_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int local_f8 [8];
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> del;
  iterator iStack_a8;
  int it;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  allocator<int> local_79;
  int local_78 [14];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> src;
  BTree tree;
  
  storage::BTree::BTree
            ((BTree *)&src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_78[8] = 0x32;
  local_78[9] = 0x34;
  local_78[10] = 0x17;
  local_78[0xb] = 0x1e;
  local_78[4] = 0xf;
  local_78[5] = 0x30;
  local_78[6] = 0x2d;
  local_78[7] = 0x2f;
  local_78[0] = 0x12;
  local_78[1] = 0x1f;
  local_78[2] = 0xc;
  local_78[3] = 10;
  local_78[0xc] = 0x14;
  local_40 = local_78;
  local_38 = 0xd;
  std::allocator<int>::allocator(&local_79);
  __l_00._M_len = local_38;
  __l_00._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l_00,&local_79);
  std::allocator<int>::~allocator(&local_79);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_a8 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff58);
    if (!bVar1) break;
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end1);
    del.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *puVar2;
    printf("\n\nINSERT %d:\n",
           (ulong)del.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage._4_4_);
    storage::BTree::insert
              ((BTree *)&src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
               del.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_,(Record *)0x0);
    storage::BTree::print
              ((BTree *)&src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  local_f8[4] = 0x1f;
  local_f8[5] = 0x34;
  local_f8[6] = 0x32;
  local_f8[0] = 0xf;
  local_f8[1] = 0x12;
  local_f8[2] = 0x17;
  local_f8[3] = 0x1e;
  local_d8 = local_f8;
  local_d0 = 7;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1_1 + 7));
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,__l,
             (allocator<int> *)((long)&__range1_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1_1 + 7));
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_118 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xfffffffffffffee8);
    if (!bVar1) break;
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end1_1);
    r._4_4_ = *puVar2;
    printf("\n\nERASE %d:\n",(ulong)r._4_4_);
    local_128 = (Record *)0x0;
    storage::BTree::erase
              ((BTree *)&src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,r._4_4_,&local_128);
    storage::BTree::print
              ((BTree *)&src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int main0()
{
    storage::BTree tree;
    std::vector<int> src{18, 31, 12, 10, 15, 48, 45, 47, 50, 52, 23, 30, 20};
    for (auto it : src)
    {
        printf("\n\nINSERT %d:\n", it);
        tree.insert(it, nullptr);
        tree.print();
    }

    std::vector<int> del{15, 18, 23, 30, 31, 52, 50};
    for (auto it : src)
    {
        printf("\n\nERASE %d:\n", it);
        storage::Record *r = nullptr;
        tree.erase(it, r);
        tree.print();
    }
    return 0;
}